

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

ostream * pstore::operator<<(ostream *stream,variant_type variant)

{
  ostream *poVar1;
  
  if (variant < 4) {
    poVar1 = std::operator<<(stream,&DAT_00122140 + *(int *)(&DAT_00122140 + (ulong)variant * 4));
    return poVar1;
  }
  poVar1 = std::operator<<(stream,"");
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid::variant_type const variant) {
        char const * str = "";
        switch (variant) {
        case uuid::variant_type::ncs: str = "ncs"; break;
        case uuid::variant_type::rfc_4122: str = "rfc_4122"; break;
        case uuid::variant_type::microsoft: str = "microsoft"; break;
        case uuid::variant_type::future: str = "future"; break; // future definition
        }
        return stream << str;
    }